

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::loadstart(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  _Rb_tree_header *p_Var1;
  CAddr CVar2;
  _Rb_tree_color x;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  Cell i;
  int iVar5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  
  requireDStackDepth(this,1,"LOADSTART");
  this_00 = &this->dStack;
  x = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (x != _S_red) {
    p_Var1 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar7]) {
      bVar7 = p_Var4[1]._M_color < x;
      if (!bVar7) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, x < p_Var3[1]._M_color)) {
      p_Var4 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
      ForthStack<unsigned_int>::push(this_00,x);
      block(this);
      ForthStack<unsigned_int>::pop(this_00);
    }
    p_Var4 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0; p_Var4 = (&p_Var4->_M_left)[bVar7])
    {
      bVar7 = (_Rb_tree_color)*(size_t *)(p_Var4 + 1) < x;
      if (!bVar7) {
        p_Var3 = p_Var4;
      }
    }
    p_Var6 = p_Var1;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
       (p_Var6 = (_Rb_tree_header *)p_Var3,
       x < (_Rb_tree_color)((_Rb_tree_header *)p_Var3)->_M_node_count)) {
      p_Var6 = p_Var1;
    }
    if (p_Var6 != p_Var1) {
      SaveInput(this);
      this->sourceid = 0;
      CVar2 = this->VarOffsetBlkAddress;
      iVar5 = 0;
      do {
        dataSpaceSet(this,CVar2 + iVar5,(Char)x);
        x = x >> 8;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 4);
      setSourceVariables(this,*(Cell *)(p_Var6 + 1),0x400,0);
      this->InterpretState = InterpretSource;
    }
  }
  return;
}

Assistant:

void loadstart(){
			REQUIRE_DSTACK_DEPTH(1, "LOADSTART");
			Cell u = dStack.getTop(); pop();
			if(u>0){
				auto foundIt = blocksInProcess.find(u);
				if (foundIt == blocksInProcess.end()) {
					push(u);
					block();
					pop();
				}
				foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					SaveInput();
					setSourceId(0);
					setDataCell(VarOffsetBlkAddress, Cell(u)); // set BLK=u
					setSourceVariables((*foundIt).second.blockLocation, 1024, 0);
					InterpretState = InterpretSource;
				} 
			}
		}